

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O1

Section * out_OverlappingSection(Section *section)

{
  ushort uVar1;
  Section *pSVar2;
  SortedSection *pSVar3;
  uint uVar4;
  
  pSVar3 = sections[section->type].banks[section->bank - sectionTypeInfo[section->type].firstBank].
           sections;
  if (pSVar3 != (SortedSection *)0x0) {
    uVar1 = section->org;
    do {
      pSVar2 = pSVar3->section;
      if (((uint)pSVar2->org < (uint)section->size + (uint)uVar1) &&
         (uVar4 = (uint)pSVar2->size + (uint)pSVar2->org, uVar1 <= uVar4 && uVar4 != uVar1)) {
        return pSVar2;
      }
      pSVar3 = pSVar3->next;
    } while (pSVar3 != (SortedSection *)0x0);
  }
  return (Section *)0x0;
}

Assistant:

struct Section const *out_OverlappingSection(struct Section const *section)
{
	struct SortedSections *banks = sections[section->type].banks;
	struct SortedSection *ptr =
		banks[section->bank - sectionTypeInfo[section->type].firstBank].sections;

	while (ptr) {
		if (ptr->section->org < section->org + section->size
		 && section->org < ptr->section->org + ptr->section->size)
			return ptr->section;
		ptr = ptr->next;
	}
	return NULL;
}